

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CpuInfo.cpp
# Opt level: O1

void __thiscall primesieve::CpuInfo::CpuInfo(CpuInfo *this)

{
  EVP_PKEY_CTX *in_RSI;
  
  *(undefined8 *)((long)&this->cpuThreads_ + 1) = 0;
  *(undefined8 *)((long)&this->threadsPerCore_ + 1) = 0;
  this->cpuCores_ = 0;
  this->cpuThreads_ = 0;
  (this->cacheSizes_)._M_elems[0] = 0;
  (this->cacheSizes_)._M_elems[1] = 0;
  (this->cacheSizes_)._M_elems[2] = 0;
  (this->cacheSizes_)._M_elems[3] = 0;
  (this->cacheSharing_)._M_elems[0] = 0;
  (this->cacheSharing_)._M_elems[1] = 0;
  (this->cacheSharing_)._M_elems[2] = 0;
  (this->cacheSharing_)._M_elems[3] = 0;
  (this->error_)._M_dataplus._M_p = (pointer)&(this->error_).field_2;
  (this->error_)._M_string_length = 0;
  (this->error_).field_2._M_local_buf[0] = '\0';
  init(this,in_RSI);
  return;
}

Assistant:

CpuInfo::CpuInfo() :
  cpuCores_(0),
  cpuThreads_(0),
  threadsPerCore_(0),
  sysctlL2CacheWorkaround_(false),
  cacheSizes_{0, 0, 0, 0},
  cacheSharing_{0, 0, 0, 0}
{
  try
  {
    init();
  }
  catch (exception& e)
  {
    // We don't trust the operating system to reliably report
    // all CPU information. In case an unexpected error
    // occurs we continue without relying on CpuInfo and
    // primesieve will fallback to using default CPU settings
    // e.g. 32 KiB L1 data cache size.
    error_ = e.what();
  }
}